

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexTriangleKernel.cpp
# Opt level: O0

void Ptex::v2_2::(anonymous_namespace)::Apply<Ptex::v2_2::PtexHalf,3>
               (PtexTriangleKernelIter *k,float *result,void *data,int param_4,int param_5)

{
  float fVar1;
  int iVar2;
  int iVar3;
  VecAccum<Ptex::v2_2::PtexHalf,_3> *this;
  VecAccum<Ptex::v2_2::PtexHalf,_3> *dst;
  long in_RDX;
  int *in_RDI;
  float fVar4;
  float fVar5;
  float weight;
  PtexHalf *pEnd;
  PtexHalf *p;
  float Q;
  float DQ;
  float V;
  float U;
  int x2;
  int x1;
  int xw;
  int vi;
  float DDQ;
  int nTxChan;
  float in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  float local_48;
  float local_44;
  int local_2c;
  
  fVar1 = (float)in_RDI[9];
  for (local_2c = in_RDI[4]; local_2c != in_RDI[7]; local_2c = local_2c + 1) {
    iVar3 = *in_RDI;
    iVar2 = PtexUtils::max<int>(in_RDI[3],(iVar3 - local_2c) - in_RDI[8]);
    iVar3 = PtexUtils::min<int>(in_RDI[6],(iVar3 - local_2c) - in_RDI[5]);
    fVar4 = (float)iVar2 - (float)in_RDI[1];
    fVar5 = (float)local_2c - (float)in_RDI[2];
    local_44 = (float)in_RDI[9] * (fVar4 + fVar4 + 1.0) + (float)in_RDI[10] * fVar5;
    local_48 = (float)in_RDI[9] * fVar4 * fVar4 +
               ((float)in_RDI[10] * fVar4 + (float)in_RDI[0xb] * fVar5) * fVar5;
    this = (VecAccum<Ptex::v2_2::PtexHalf,_3> *)
           (in_RDX + (long)((local_2c * *in_RDI + iVar2) * 3) * 2);
    dst = this + (long)((iVar3 - iVar2) * 3) * 2;
    for (; this < dst; this = this + 6) {
      if (local_48 < 1.0) {
        fVar4 = anon_unknown_2::gaussian(0.0);
        fVar4 = fVar4 * (float)in_RDI[0xd];
        in_RDI[0xe] = (int)(fVar4 + (float)in_RDI[0xe]);
        PtexUtils::VecAccum<Ptex::v2_2::PtexHalf,_3>::VecAccum
                  ((VecAccum<Ptex::v2_2::PtexHalf,_3> *)&stack0xffffffffffffffa3);
        PtexUtils::VecAccum<Ptex::v2_2::PtexHalf,_3>::operator()
                  (this,(float *)dst,(PtexHalf *)CONCAT44(fVar4,in_stack_ffffffffffffffa0),
                   in_stack_ffffffffffffff9c);
      }
      local_48 = local_44 + local_48;
      local_44 = fVar1 * 2.0 + local_44;
    }
  }
  return;
}

Assistant:

void Apply(PtexTriangleKernelIter& k, float* result, void* data, int /*nChan*/, int /*nTxChan*/)
    {
        int nTxChan = nChan;
        float DDQ = 2.0f*k.A;
        for (int vi = k.v1; vi != k.v2; vi++) {
            int xw = k.rowlen - vi;
            int x1 = PtexUtils::max(k.u1, xw-k.w2);
            int x2 = PtexUtils::min(k.u2, xw-k.w1);
            float U = (float)x1 - k.u;
            float V = (float)vi - k.v;
            float DQ = k.A*(2.0f*U+1.0f)+k.B*V;
            float Q = k.A*U*U + (k.B*U + k.C*V)*V;
            T* p = static_cast<T*>(data) + (vi * k.rowlen + x1) * nTxChan;
            T* pEnd = p + (x2-x1)*nTxChan;
            for (; p < pEnd; p += nTxChan) {
                if (Q < 1.0f) {
                    float weight = gaussian(Q)*k.wscale;
                    k.weight += weight;
                    PtexUtils::VecAccum<T,nChan>()(result, p, weight);
                }
                Q += DQ;
                DQ += DDQ;
            }
        }
    }